

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O1

void __thiscall mp::SPAdapter::ProcessObjs(SPAdapter *this)

{
  vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  *this_00;
  SPAdapter *pSVar1;
  int iVar2;
  ColProblem *pCVar3;
  pointer pBVar4;
  pointer pLVar5;
  size_ty sVar6;
  long lVar7;
  pointer piVar8;
  double dVar9;
  int iVar10;
  ulong uVar11;
  Impl *pIVar12;
  Error *pEVar13;
  double *pdVar14;
  ulong uVar15;
  double *pdVar16;
  ExprBase e;
  uint uVar17;
  vector<double,_std::allocator<double>_> core_obj;
  vector<double,_std::allocator<double>_> local_78;
  Term local_60;
  vector<double,_std::allocator<double>_> *local_50;
  double local_48;
  undefined8 uStack_40;
  Impl *local_38;
  
  iVar10 = (int)((long)(this->problem_->super_Problem).linear_objs_.
                       super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(this->problem_->super_Problem).linear_objs_.
                       super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) * -0x11111111;
  if (iVar10 != 0) {
    iVar2 = *(this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = &this->nonlinear_objs_;
    std::
    vector<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
    ::reserve(this_00,(long)iVar10);
    pCVar3 = this->problem_;
    uVar11 = ((long)(pCVar3->super_Problem).linear_objs_.
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pCVar3->super_Problem).linear_objs_.
                    super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
    if ((int)uVar11 != 0) {
      uVar15 = 0;
      do {
        pBVar4 = (pCVar3->super_Problem).nonlinear_objs_.
                 super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar15 < (ulong)((long)(pCVar3->super_Problem).nonlinear_objs_.
                                   super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar4 >> 3))
        {
          local_60._0_8_ = pBVar4[uVar15].super_ExprBase.impl_;
        }
        else {
          local_60._0_8_ = (Impl *)0x0;
        }
        std::
        vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
        ::emplace_back<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((vector<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,std::allocator<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>>
                    *)this_00,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)&local_60);
        uVar15 = uVar15 + 1;
      } while ((uVar11 & 0xffffffff) != uVar15);
    }
    pCVar3 = this->problem_;
    uVar17 = (uint)((ulong)((long)(this->var_core2orig_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->var_core2orig_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
    std::vector<double,_std::allocator<double>_>::vector
              (&local_78,(long)(int)uVar17,(allocator_type *)&local_60);
    pLVar5 = (pCVar3->super_Problem).linear_objs_.
             super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = *(size_ty *)
             ((long)&(pLVar5->terms_).
                     super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> + 0x10);
    if (sVar6 != 0) {
      lVar7 = *(long *)&(pLVar5->terms_).
                        super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>;
      piVar8 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar14 = (double *)(lVar7 + 8);
      do {
        iVar10 = piVar8[*(int *)(pdVar14 + -1)];
        if (iVar2 <= iVar10) {
          if ((*pdVar14 != 0.0) || (NAN(*pdVar14))) {
            pEVar13 = (Error *)__cxa_allocate_exception(0x18);
            Error::Error(pEVar13,(CStringRef)0x16f9ba,-1);
            __cxa_throw(pEVar13,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
        }
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar10] = *pdVar14;
        pdVar16 = pdVar14 + 1;
        pdVar14 = pdVar14 + 2;
      } while (pdVar16 != (double *)(sVar6 * 0x10 + lVar7));
    }
    pBVar4 = (pCVar3->super_Problem).nonlinear_objs_.
             super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pCVar3->super_Problem).nonlinear_objs_.
        super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == pBVar4) {
      e.impl_ = (Impl *)0x0;
    }
    else {
      e.impl_ = (pBVar4->super_ExprBase).impl_;
    }
    if (e.impl_ != (Impl *)0x0) {
      if ((e.impl_)->kind_ == CALL) {
        iVar10 = strcmp((char *)(*(long *)(e.impl_ + 2) + 8),"expectation");
        if (iVar10 == 0) {
          if (e.impl_[4].kind_ != FIRST_EXPR) {
LAB_00161b90:
            pEVar13 = (Error *)__cxa_allocate_exception(0x18);
            Error::Error(pEVar13,(CStringRef)0x16fb1c,-1);
            __cxa_throw(pEVar13,&Error::typeinfo,fmt::SystemError::~SystemError);
          }
          pIVar12 = e.impl_ + 6;
          e.impl_ = (Impl *)0x0;
          if ((*(Impl **)pIVar12)->kind_ - FIRST_EXPR < 0x2f) {
            e.impl_ = *(Impl **)pIVar12;
          }
          if (e.impl_ == (Impl *)0x0) goto LAB_00161b90;
          (((this_00->
            super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
            )._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_ = (Impl *)0x0;
        }
      }
      local_60._0_8_ = &PTR__BasicExprVisitor_0019b688;
      local_48 = 0.0;
      uStack_40 = 0x3ff0000000000000;
      local_60.coef_ = (double)this;
      local_50 = &local_78;
      BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<mp::internal::AffineExprExtractor,_void,_mp::internal::ExprTypes>
                  *)&local_60,(Expr)e.impl_);
      dVar9 = local_48;
      if ((local_48 != 0.0) || (NAN(local_48))) {
        local_38 = (Impl *)0x0;
        std::
        vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
        ::emplace_back<mp::internal::ExprBase::Impl_const*>
                  ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                    *)&(this->factory_).exprs_,&local_38);
        pIVar12 = (Impl *)operator_new__(0x80);
        pIVar12->kind_ = FIRST_EXPR;
        (this->factory_).exprs_.
        super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar12;
        *(double *)(pIVar12 + 2) = dVar9;
        (((this->nonlinear_objs_).
          super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->super_ExprBase).impl_ = pIVar12;
      }
    }
    if (0 < (int)uVar17) {
      uVar11 = 0;
      do {
        pSVar1 = (SPAdapter *)
                 local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
        if (((double)pSVar1 != 0.0) || (NAN((double)pSVar1))) {
          local_60.var_index_ = (int)uVar11;
          local_60.coef_ = (double)pSVar1;
          gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::
          append_element<mp::LinearExpr::Term>
                    ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
                     &this->linear_obj_,&local_60);
        }
        uVar11 = uVar11 + 1;
      } while ((uVar17 & 0x7fffffff) != uVar11);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SPAdapter::ProcessObjs() {
  int num_objs = problem_.num_objs();
  if (num_objs == 0)
    return;
  int num_stage1_vars = num_stage_vars_[0];
  nonlinear_objs_.reserve(num_objs);
  auto objs = problem_.objs();
  for (auto i = objs.begin(), end = objs.end(); i != end; ++i)
    nonlinear_objs_.push_back(i->nonlinear_expr());
  // Strip expectation from the first objective.
  auto obj = problem_.obj(0);
  int num_vars = this->num_vars();
  std::vector<double> core_obj(num_vars);
  const auto &linear = obj.linear_expr();
  for (auto i = linear.begin(), end = linear.end(); i != end; ++i) {
    int core_var_index = var_orig2core_[i->var_index()];
    if (core_var_index >= num_stage1_vars && i->coef() != 0)
      throw Error("second-stage variable outside of expectation in objective");
    core_obj[core_var_index] = i->coef();
  }
  auto obj_expr = obj.nonlinear_expr();
  if (obj_expr) {
    auto call = Cast<CallExpr>(obj_expr);
    if (call && std::strcmp(call.function().name(), "expectation") == 0) {
      if (call.num_args() != 1 || !(obj_expr = Cast<NumericExpr>(call.arg(0))))
        throw Error("invalid arguments to expectation");
      nonlinear_objs_[0] = mp::NumericExpr();
    }
    internal::AffineExprExtractor extractor(*this, core_obj);
    extractor.Visit(obj_expr);
    if (auto constant = extractor.constant())
      nonlinear_objs_[0] = factory_.MakeNumericConstant(constant);
  }
  for (int i = 0; i < num_vars; ++i) {
    if (auto obj = core_obj[i])
      linear_obj_.AddTerm(i, obj);
  }
}